

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O0

bool __thiscall QSslKey::operator==(QSslKey *this,QSslKey *other)

{
  long lVar1;
  bool bVar2;
  KeyAlgorithm KVar3;
  KeyAlgorithm KVar4;
  KeyType KVar5;
  KeyType KVar6;
  int iVar7;
  int iVar8;
  HANDLE pvVar9;
  HANDLE pvVar10;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QSslKey *in_stack_ffffffffffffff48;
  QByteArray *in_stack_ffffffffffffff60;
  QByteArray *this_00;
  undefined1 local_69;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isNull(in_stack_ffffffffffffff48);
  if (bVar2) {
    local_69 = isNull(in_stack_ffffffffffffff48);
  }
  else {
    bVar2 = isNull(in_stack_ffffffffffffff48);
    if (bVar2) {
      local_69 = isNull(in_stack_ffffffffffffff48);
    }
    else {
      KVar3 = algorithm(in_stack_ffffffffffffff48);
      KVar4 = algorithm(in_stack_ffffffffffffff48);
      if (KVar3 == KVar4) {
        KVar5 = type(in_stack_ffffffffffffff48);
        KVar6 = type(in_stack_ffffffffffffff48);
        if (KVar5 == KVar6) {
          iVar7 = length(in_stack_ffffffffffffff48);
          iVar8 = length(in_stack_ffffffffffffff48);
          if (iVar7 == iVar8) {
            KVar3 = algorithm(in_stack_ffffffffffffff48);
            if (KVar3 == Opaque) {
              pvVar9 = handle(in_stack_ffffffffffffff48);
              pvVar10 = handle(in_stack_ffffffffffffff48);
              local_69 = pvVar9 == pvVar10;
            }
            else {
              QByteArray::QByteArray((QByteArray *)0x39e927);
              toDer((QSslKey *)in_RSI,in_RDI);
              this_00 = in_RSI;
              QByteArray::QByteArray((QByteArray *)0x39e955);
              toDer((QSslKey *)this_00,in_RDI);
              local_69 = ::operator==(in_stack_ffffffffffffff60,in_RSI);
              QByteArray::~QByteArray((QByteArray *)0x39e98b);
              QByteArray::~QByteArray((QByteArray *)0x39e995);
              QByteArray::~QByteArray((QByteArray *)0x39e9a2);
              QByteArray::~QByteArray((QByteArray *)0x39e9af);
            }
          }
          else {
            local_69 = false;
          }
        }
        else {
          local_69 = false;
        }
      }
      else {
        local_69 = false;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslKey::operator==(const QSslKey &other) const
{
    if (isNull())
        return other.isNull();
    if (other.isNull())
        return isNull();
    if (algorithm() != other.algorithm())
        return false;
    if (type() != other.type())
        return false;
    if (length() != other.length())
        return false;
    if (algorithm() == QSsl::Opaque)
        return handle() == other.handle();
    return toDer() == other.toDer();
}